

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.hpp
# Opt level: O0

void __thiscall
ableton::link::
Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::setTimeline(Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
              *this,Timeline *newTimeline,microseconds atTime)

{
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *this_00;
  anon_class_40_3_27407e53_for_handler_ local_80;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> lock;
  Timeline local_38;
  Timeline *local_20;
  Timeline *newTimeline_local;
  Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *this_local;
  microseconds atTime_local;
  
  lock._M_device =
       (mutex_type *)
       (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_20 = newTimeline;
  newTimeline_local = (Timeline *)this;
  this_local = (Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
                *)atTime.__r;
  clampTempo(&local_38,(Timeline *)&lock);
  Timeline::operator=(newTimeline,&local_38);
  std::lock_guard<std::mutex>::lock_guard(&local_58,&this->mClientTimelineGuard);
  Timeline::operator=(&this->mClientTimeline,newTimeline);
  std::lock_guard<std::mutex>::~lock_guard(&local_58);
  this_00 = ableton::util::
            Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
            ::operator->(&this->mIo);
  local_80.newTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_80.newTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (tuple<long>)
       (newTimeline->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_80.newTimeline.timeOrigin.__r = (newTimeline->timeOrigin).__r;
  local_80.atTime.__r = (rep)this_local;
  local_80.this = this;
  ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>
  ::
  async<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::setTimeline(ableton::link::Timeline,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
            ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)this_00,
             &local_80);
  return;
}

Assistant:

void setTimeline(Timeline newTimeline, const std::chrono::microseconds atTime)
  {
    newTimeline = clampTempo(newTimeline);
    {
      std::lock_guard<std::mutex> lock(mClientTimelineGuard);
      mClientTimeline = newTimeline;
    }
    mIo->async([this, newTimeline, atTime] {
      handleTimelineFromClient(updateSessionTimelineFromClient(
        mSessionTimeline, newTimeline, atTime, mGhostXForm));
    });
  }